

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O0

Vec_Ptr_t * Sim_SimulateSeqModel(Abc_Ntk_t *pNtk,int nFrames,int *pModel)

{
  void *pvVar1;
  uint *puVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Ptr_t *vInfo_00;
  Abc_Obj_t *pAVar7;
  int local_40;
  int local_3c;
  int k;
  int i;
  uint *pUnsigned;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vInfo;
  int *pModel_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar4 = Abc_NtkObjNumMax(pNtk);
  vInfo_00 = Sim_UtilInfoAlloc(iVar4,nFrames,0);
  pAVar7 = Abc_AigConst1(pNtk);
  Sim_UtilSetConst((uint *)vInfo_00->pArray[pAVar7->Id],nFrames,1);
  for (local_3c = 0; iVar4 = Abc_NtkPiNum(pNtk), local_3c < iVar4; local_3c = local_3c + 1) {
    pAVar7 = Abc_NtkPi(pNtk,local_3c);
    pvVar1 = vInfo_00->pArray[pAVar7->Id];
    for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
      iVar4 = Abc_NtkPiNum(pNtk);
      uVar3 = 0;
      if (pModel[local_40 * iVar4 + local_3c] != 0) {
        uVar3 = 0xffffffff;
      }
      *(undefined4 *)((long)pvVar1 + (long)local_40 * 4) = uVar3;
    }
  }
  for (local_3c = 0; iVar4 = Vec_PtrSize(pNtk->vBoxes), local_3c < iVar4; local_3c = local_3c + 1) {
    pAVar7 = Abc_NtkBox(pNtk,local_3c);
    iVar4 = Abc_ObjIsLatch(pAVar7);
    if (iVar4 != 0) {
      puVar2 = (uint *)vInfo_00->pArray[pAVar7->Id];
      iVar4 = Abc_LatchIsInit0(pAVar7);
      if (iVar4 == 0) {
        iVar4 = Abc_LatchIsInit1(pAVar7);
        if (iVar4 == 0) {
          iVar4 = rand();
          iVar5 = rand();
          uVar6 = rand();
          *puVar2 = iVar4 << 0x18 ^ iVar5 << 0xc ^ uVar6;
        }
        else {
          *puVar2 = 0xffffffff;
        }
      }
      else {
        *puVar2 = 0;
      }
    }
  }
  for (local_3c = 0; local_3c < nFrames; local_3c = local_3c + 1) {
    Sim_SimulateSeqFrame(vInfo_00,pNtk,local_3c,1,(uint)(local_3c < nFrames + -1));
  }
  return vInfo_00;
}

Assistant:

Vec_Ptr_t * Sim_SimulateSeqModel( Abc_Ntk_t * pNtk, int nFrames, int * pModel )
{
    Vec_Ptr_t * vInfo;
    Abc_Obj_t * pNode;
    unsigned * pUnsigned;
    int i, k;
    vInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nFrames, 0 );
    // set the constant data
    pNode = Abc_AigConst1(pNtk);
    Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nFrames, 1 );
    // set the random PI data
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pUnsigned = Sim_SimInfoGet(vInfo,pNode);
        for ( k = 0; k < nFrames; k++ )
            pUnsigned[k] = pModel[k * Abc_NtkPiNum(pNtk) + i] ? ~((unsigned)0) : 0;
    }
    // set the initial state data
    Abc_NtkForEachLatch( pNtk, pNode, i )
    {
        pUnsigned = Sim_SimInfoGet(vInfo,pNode);
        if ( Abc_LatchIsInit0(pNode) )
            pUnsigned[0] = 0;
        else if ( Abc_LatchIsInit1(pNode) )
            pUnsigned[0] = ~((unsigned)0);
        else 
            pUnsigned[0] = SIM_RANDOM_UNSIGNED;
    }
    // simulate the nodes for the given number of timeframes
    for ( i = 0; i < nFrames; i++ )
        Sim_SimulateSeqFrame( vInfo, pNtk, i, 1, (int)(i < nFrames-1) );
/*
    // print the simulated values
    for ( i = 0; i < nFrames; i++ )
    {
        printf( "Frame %d : ", i+1 );
        Abc_NtkForEachPi( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( " " );
        Abc_NtkForEachLatch( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( " " );
        Abc_NtkForEachPo( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( "\n" );
    }
    printf( "\n" );
*/
    return vInfo;
}